

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError SetAlphaAndImageChunks(WebPData *bitstream,int copy_data,WebPMuxImage *wpi)

{
  int iVar1;
  int image_tag;
  WebPMuxError err;
  WebPData alpha;
  WebPData image;
  int is_lossless;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  WebPData *in_stack_ffffffffffffffb8;
  WebPData *in_stack_ffffffffffffffc0;
  WebPData *in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  WebPMuxError local_4;
  
  uVar2 = 0;
  local_4 = GetImageData(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8,
                         (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((local_4 == WEBP_MUX_OK) &&
     (((in_stack_ffffffffffffffb8 == (WebPData *)0x0 ||
       (local_4 = AddDataToChunkList((WebPData *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                                     in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                     (WebPChunk **)in_stack_ffffffffffffffc8),
       local_4 == WEBP_MUX_OK)) &&
      (local_4 = AddDataToChunkList((WebPData *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                                    in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                    (WebPChunk **)in_stack_ffffffffffffffc8), local_4 == WEBP_MUX_OK
      )))) {
    iVar1 = MuxImageFinalize((WebPMuxImage *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
    if (iVar1 != 0) {
      local_4 = WEBP_MUX_OK;
    }
  }
  return local_4;
}

Assistant:

static WebPMuxError SetAlphaAndImageChunks(
    const WebPData* const bitstream, int copy_data, WebPMuxImage* const wpi) {
  int is_lossless = 0;
  WebPData image, alpha;
  WebPMuxError err = GetImageData(bitstream, &image, &alpha, &is_lossless);
  const int image_tag =
      is_lossless ? kChunks[IDX_VP8L].tag : kChunks[IDX_VP8].tag;
  if (err != WEBP_MUX_OK) return err;
  if (alpha.bytes != NULL) {
    err = AddDataToChunkList(&alpha, copy_data, kChunks[IDX_ALPHA].tag,
                             &wpi->alpha_);
    if (err != WEBP_MUX_OK) return err;
  }
  err = AddDataToChunkList(&image, copy_data, image_tag, &wpi->img_);
  if (err != WEBP_MUX_OK) return err;
  return MuxImageFinalize(wpi) ? WEBP_MUX_OK : WEBP_MUX_INVALID_ARGUMENT;
}